

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SNMPPacket.cpp
# Opt level: O2

snmp_request_id_t SNMPPacket::generate_request_id(void)

{
  int iVar1;
  int iVar2;
  snmp_request_id_t sVar3;
  
  sVar3 = 0;
  while (sVar3 == 0) {
    iVar1 = rand();
    iVar2 = rand();
    sVar3 = (long)iVar2 | (long)iVar1 << 8;
  }
  return sVar3;
}

Assistant:

snmp_request_id_t SNMPPacket::generate_request_id(){
    //NOTE: do not generate 0
    snmp_request_id_t request_id = 0;
    while(request_id == 0){
        request_id |= rand();
        request_id <<= 8;
        request_id |= rand();
    }
    return request_id;
}